

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decodetxb.c
# Opt level: O3

void av1_read_coeffs_txb(AV1_COMMON *cm,DecoderCodingBlock *dcb,aom_reader *r,int plane,int row,
                        int col,TX_SIZE tx_size)

{
  od_ec_dec *dec;
  short *psVar1;
  aom_cdf_prob (*icdf) [6];
  aom_cdf_prob (*icdf_00) [10];
  aom_cdf_prob (*icdf_01) [9];
  BLOCK_SIZE plane_bsize;
  TX_CLASS TVar2;
  ushort uVar3;
  ushort uVar4;
  ushort uVar5;
  short sVar6;
  MB_MODE_INFO *pMVar7;
  FRAME_CONTEXT *pFVar8;
  tran_low_t *ptVar9;
  eob_info *peVar10;
  MB_MODE_INFO *pMVar11;
  int16_t *piVar12;
  undefined1 auVar13 [14];
  undefined1 auVar14 [14];
  short sVar15;
  undefined1 auVar16 [14];
  undefined1 auVar17 [13];
  uint3 uVar18;
  undefined1 auVar19 [13];
  undefined1 auVar20 [13];
  undefined1 auVar21 [13];
  uint5 uVar22;
  undefined1 auVar23 [13];
  undefined1 auVar24 [14];
  undefined1 auVar25 [13];
  char cVar26;
  uint8_t uVar27;
  ushort uVar28;
  int iVar29;
  uint uVar30;
  uint uVar31;
  int iVar32;
  int iVar33;
  int iVar34;
  int iVar35;
  int iVar36;
  int iVar37;
  uint *puVar38;
  qm_val_t *pqVar39;
  byte bVar40;
  byte bVar41;
  byte bVar42;
  byte bVar43;
  byte bVar44;
  uint *puVar45;
  aom_cdf_prob (*paaVar46) [5];
  int iVar47;
  uint uVar48;
  aom_cdf_prob *paVar49;
  byte *pbVar50;
  int col_3;
  uint uVar51;
  int iVar52;
  aom_cdf_prob (*paaVar53) [3];
  ulong uVar54;
  ulong uVar55;
  long lVar56;
  byte bVar57;
  ulong uVar58;
  long lVar59;
  ulong uVar60;
  long lVar61;
  byte *pbVar62;
  ulong uVar63;
  int col_1;
  ulong uVar64;
  int col_2;
  uint uVar65;
  long lVar66;
  int iVar67;
  aom_cdf_prob (*icdf_02) [8];
  uint16_t *puVar68;
  aom_cdf_prob (*icdf_03) [11];
  bool bVar69;
  bool bVar70;
  undefined4 uVar73;
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  ushort uVar82;
  ushort uVar83;
  ushort uVar84;
  ushort uVar85;
  undefined1 auVar81 [16];
  ushort uVar88;
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  char local_661;
  byte local_644;
  byte local_558 [12];
  byte abStack_54c [4];
  byte abStack_548 [1304];
  
  pMVar7 = *(dcb->xd).mi;
  puVar45 = (uint *)((dcb->xd).plane[plane].above_entropy_context + col);
  plane_bsize = av1_ss_size_lookup[pMVar7->bsize][(dcb->xd).plane[plane].subsampling_x]
                [(dcb->xd).plane[plane].subsampling_y];
  uVar64 = (ulong)plane_bsize;
  puVar38 = (uint *)((dcb->xd).plane[plane].left_entropy_context + row);
  uVar54 = (ulong)tx_size;
  switch(tx_size) {
  case '\0':
    bVar40 = (byte)*puVar45;
    bVar41 = (byte)*puVar38;
    local_661 = get_txb_ctx_general_dc_sign_contexts
                [(long)*(char *)((long)&get_txb_ctx_general_signs + (ulong)(bVar41 >> 3)) +
                 (long)*(char *)((long)&get_txb_ctx_general_signs + (ulong)(bVar40 >> 3)) + 0x20];
    if (plane == 0) {
      if (uVar64 == 0) {
        uVar64 = 0;
      }
      else {
        uVar30 = (uint)(bVar40 & 7);
        if (3 < (bVar40 & 7)) {
          uVar30 = 4;
        }
        uVar31 = 4;
        if ((bVar41 & 7) < 4) {
          uVar31 = (uint)(bVar41 & 7);
        }
        uVar64 = (ulong)(byte)get_txb_ctx_general_skip_contexts[(ulong)uVar31 + (ulong)uVar30 * 5];
      }
    }
    else {
      lVar56 = ((ulong)(uVar64 != 0) * 3 + 1) - (ulong)(bVar40 == 0);
      bVar69 = bVar41 == 0;
LAB_0017f71c:
      uVar64 = (lVar56 - (ulong)bVar69) + 8;
    }
    break;
  case '\x01':
    lVar56 = 0;
    uVar55 = 0;
    bVar69 = true;
    do {
      bVar70 = bVar69;
      uVar55 = (ulong)(uint)((int)uVar55 +
                            (int)*(char *)((long)&get_txb_ctx_general_signs +
                                          (ulong)(*(byte *)((long)puVar45 + lVar56) >> 3)));
      lVar56 = 1;
      bVar69 = false;
    } while (bVar70);
    lVar56 = 0;
    bVar69 = true;
    do {
      bVar70 = bVar69;
      uVar55 = (long)(int)uVar55 +
               (long)*(char *)((long)&get_txb_ctx_general_signs +
                              (ulong)(*(byte *)((long)puVar38 + lVar56) >> 3));
      lVar56 = 1;
      bVar69 = false;
    } while (bVar70);
    local_661 = get_txb_ctx_general_dc_sign_contexts[uVar55 + 0x20];
    if (plane != 0) {
      lVar56 = ((ulong)((0x3cfff0UL >> (uVar64 & 0x3f) & 1) != 0) * 3 + 1) -
               (ulong)((short)*puVar45 == 0);
      bVar69 = (short)*puVar38 == 0;
      goto LAB_0017f71c;
    }
    if (plane_bsize != BLOCK_8X8) {
      bVar40 = (*(byte *)((long)puVar45 + 1) | (byte)*puVar45) & 7;
      uVar31 = (uint)bVar40;
      if (3 < bVar40) {
        uVar31 = 4;
      }
      bVar40 = (*(byte *)((long)puVar38 + 1) | (byte)*puVar38) & 7;
      uVar30 = 4;
      if (bVar40 < 4) {
        uVar30 = (uint)bVar40;
      }
      goto LAB_0018115a;
    }
LAB_0017fdb5:
    uVar64 = 0;
    break;
  case '\x02':
    lVar56 = 0;
    uVar55 = 0;
    do {
      uVar55 = (ulong)(uint)((int)uVar55 +
                            (int)*(char *)((long)&get_txb_ctx_general_signs +
                                          (ulong)(*(byte *)((long)puVar45 + lVar56) >> 3)));
      lVar56 = lVar56 + 1;
    } while (lVar56 != 4);
    lVar56 = 0;
    do {
      uVar55 = (long)(int)uVar55 +
               (long)*(char *)((long)&get_txb_ctx_general_signs +
                              (ulong)(*(byte *)((long)puVar38 + lVar56) >> 3));
      lVar56 = lVar56 + 1;
    } while (lVar56 != 4);
    local_661 = get_txb_ctx_general_dc_sign_contexts[uVar55 + 0x20];
    if (plane != 0) {
      lVar56 = ((ulong)((0x30ff80UL >> (uVar64 & 0x3f) & 1) != 0) * 3 + 1) - (ulong)(*puVar45 == 0);
      bVar69 = *puVar38 == 0;
      goto LAB_0017f71c;
    }
    if (plane_bsize == BLOCK_16X16) goto LAB_0017fdb5;
    uVar30 = *puVar45 >> 0x10 | *puVar45;
    bVar40 = ((byte)(uVar30 >> 8) | (byte)uVar30) & 7;
    uVar30 = *puVar38 >> 0x10 | *puVar38;
    uVar31 = (uint)bVar40;
    if (3 < bVar40) {
      uVar31 = 4;
    }
    bVar40 = ((byte)(uVar30 >> 8) | (byte)uVar30) & 7;
    uVar30 = 4;
    if (bVar40 < 4) {
      uVar30 = (uint)bVar40;
    }
LAB_0018115a:
    uVar64 = (ulong)(byte)get_txb_ctx_general_skip_contexts[(ulong)uVar30 + (ulong)uVar31 * 5];
    break;
  case '\x03':
    lVar56 = 0;
    uVar55 = 0;
    do {
      uVar55 = (ulong)(uint)((int)uVar55 +
                            (int)*(char *)((long)&get_txb_ctx_general_signs +
                                          (ulong)(*(byte *)((long)puVar45 + lVar56) >> 3)));
      lVar56 = lVar56 + 1;
    } while (lVar56 != 8);
    lVar56 = 0;
    do {
      uVar55 = (long)(int)uVar55 +
               (long)*(char *)((long)&get_txb_ctx_general_signs +
                              (ulong)(*(byte *)((long)puVar38 + lVar56) >> 3));
      lVar56 = lVar56 + 1;
    } while (lVar56 != 8);
    local_661 = get_txb_ctx_general_dc_sign_contexts[uVar55 + 0x20];
    if (plane != 0) {
      lVar56 = ((ulong)(uVar64 - 10 < 6) * 3 + 1) - (ulong)(*(long *)puVar45 == 0);
      bVar69 = *(long *)puVar38 == 0;
      goto LAB_0017f71c;
    }
    if (plane_bsize == BLOCK_32X32) goto LAB_0017fdb5;
    uVar30 = *puVar45 | puVar45[1];
    auVar17[0xc] = (char)(uVar30 >> 0x18);
    auVar17._0_12_ = ZEXT712(0);
    uVar22 = CONCAT32(auVar17._10_3_,(ushort)(byte)(uVar30 >> 0x10));
    auVar25._5_8_ = 0;
    auVar25._0_5_ = uVar22;
    auVar72[5] = 0;
    auVar72[4] = (byte)(uVar30 >> 8);
    auVar72._6_7_ = SUB137(auVar25 << 0x40,6);
    auVar72._0_4_ = uVar30 & 0xff;
    auVar72._13_3_ = 0;
    uVar73 = (undefined4)uVar22;
    uVar18 = auVar17._10_3_ >> 0x10;
    auVar87._4_3_ = uVar18;
    auVar87._0_4_ = uVar73;
    auVar87[7] = 0;
    auVar87._8_4_ = uVar73;
    auVar87._12_3_ = uVar18;
    auVar87[0xf] = 0;
    uVar30 = *puVar38 | puVar38[1];
    uVar64 = (ulong)(ushort)uVar30 & 0xffffffffffff00ff;
    auVar19._8_4_ = 0;
    auVar19._0_8_ = uVar64;
    auVar19[0xc] = (char)(uVar30 >> 0x18);
    auVar20[8] = (char)(uVar30 >> 0x10);
    auVar20._0_8_ = uVar64;
    auVar20[9] = 0;
    auVar20._10_3_ = auVar19._10_3_;
    auVar23._5_8_ = 0;
    auVar23._0_5_ = auVar20._8_5_;
    auVar77._0_4_ = (undefined4)uVar64;
    auVar21[4] = (char)(uVar30 >> 8);
    auVar21._0_4_ = auVar77._0_4_;
    auVar21[5] = 0;
    auVar21._6_7_ = SUB137(auVar23 << 0x40,6);
    auVar77._4_9_ = auVar21._4_9_;
    auVar77._13_3_ = 0;
    uVar18 = auVar19._10_3_ >> 0x10;
    auVar89._4_3_ = uVar18;
    auVar89._0_4_ = auVar20._8_4_;
    auVar89[7] = 0;
    auVar89._8_4_ = auVar20._8_4_;
    auVar89._12_3_ = uVar18;
    auVar89[0xf] = 0;
    uVar30 = (SUB164(auVar87 | auVar72,4) | SUB164(auVar87 | auVar72,0)) & 7;
    if (3 < uVar30) {
      uVar30 = 4;
    }
    uVar31 = (SUB164(auVar89 | auVar77,4) | SUB164(auVar89 | auVar77,0)) & 7;
    if (3 < uVar31) {
      uVar31 = 4;
    }
    uVar64 = (ulong)(byte)get_txb_ctx_general_skip_contexts[(ulong)uVar31 + (ulong)uVar30 * 5];
    break;
  default:
    uVar30 = *(uint *)((long)tx_size_wide_unit + (ulong)((uint)tx_size * 4));
    uVar55 = 1;
    if (1 < (int)uVar30) {
      uVar55 = (ulong)uVar30;
    }
    uVar30 = *(uint *)((long)tx_size_high_unit + (ulong)((uint)tx_size * 4));
    uVar58 = 0;
    uVar60 = 0;
    do {
      uVar60 = (ulong)(uint)((int)uVar60 +
                            (int)*(char *)((long)&get_txb_ctx_general_signs +
                                          (ulong)(*(byte *)((long)puVar45 + uVar58) >> 3)));
      uVar58 = uVar58 + 1;
    } while (uVar55 != uVar58);
    uVar58 = 1;
    if (1 < (int)uVar30) {
      uVar58 = (ulong)uVar30;
    }
    uVar63 = 0;
    do {
      uVar60 = (long)(int)uVar60 +
               (long)*(char *)((long)&get_txb_ctx_general_signs +
                              (ulong)(*(byte *)((long)puVar38 + uVar63) >> 3));
      uVar63 = uVar63 + 1;
    } while (uVar58 != uVar63);
    local_661 = get_txb_ctx_general_dc_sign_contexts[uVar60 + 0x20];
    if (plane == 0) {
      uVar64 = 0;
      if (txsize_to_bsize[uVar54] != plane_bsize) {
        uVar60 = 0;
        do {
          uVar30 = (uint)uVar64 | (uint)*(byte *)((long)puVar45 + uVar60);
          uVar64 = (ulong)uVar30;
          uVar60 = uVar60 + 1;
        } while (uVar55 != uVar60);
        uVar64 = 0;
        uVar31 = 0;
        do {
          uVar31 = uVar31 | *(byte *)((long)puVar38 + uVar64);
          uVar64 = uVar64 + 1;
        } while (uVar58 != uVar64);
        uVar30 = uVar30 & 7;
        if (3 < uVar30) {
          uVar30 = 4;
        }
        uVar51 = uVar31 & 7;
        if (3 < (uVar31 & 7)) {
          uVar51 = 4;
        }
        uVar64 = (ulong)(byte)get_txb_ctx_general_skip_contexts[(ulong)uVar51 + (ulong)uVar30 * 5];
      }
      break;
    }
    switch(uVar54) {
    case 0:
      bVar69 = (byte)*puVar45 == 0;
      goto LAB_00181280;
    case 1:
      bVar69 = (short)*puVar45 == 0;
      goto LAB_001812a0;
    case 2:
      bVar69 = *puVar45 == 0;
      break;
    case 3:
      bVar69 = *(long *)puVar45 == 0;
      goto LAB_0018124e;
    case 4:
      bVar69 = *(long *)(puVar45 + 2) == 0 && *(long *)puVar45 == 0;
      goto LAB_00181266;
    case 5:
      bVar69 = (byte)*puVar45 == 0;
      goto LAB_001812a0;
    case 6:
      bVar69 = (short)*puVar45 == 0;
      goto LAB_00181280;
    case 7:
      bVar69 = (short)*puVar45 == 0;
      break;
    case 8:
      bVar69 = *puVar45 == 0;
      goto LAB_001812a0;
    case 9:
      bVar69 = *puVar45 == 0;
      goto LAB_0018124e;
    case 10:
      bVar69 = *(long *)puVar45 == 0;
      break;
    case 0xb:
      bVar69 = *(long *)puVar45 == 0;
      goto LAB_00181266;
    case 0xc:
      bVar69 = *(long *)(puVar45 + 2) == 0 && *(long *)puVar45 == 0;
      goto LAB_0018124e;
    case 0xd:
      bVar69 = (byte)*puVar45 == 0;
      break;
    case 0xe:
      bVar69 = *puVar45 == 0;
LAB_00181280:
      bVar69 = !bVar69;
      bVar70 = (byte)*puVar38 == 0;
      goto LAB_001812a7;
    case 0xf:
      bVar69 = (short)*puVar45 == 0;
LAB_0018124e:
      bVar69 = !bVar69;
      bVar70 = *(long *)puVar38 == 0;
      goto LAB_001812a7;
    case 0x10:
      bVar69 = *(long *)puVar45 == 0;
LAB_001812a0:
      bVar69 = !bVar69;
      bVar70 = (short)*puVar38 == 0;
      goto LAB_001812a7;
    case 0x11:
      bVar69 = *puVar45 == 0;
LAB_00181266:
      bVar69 = !bVar69;
      bVar70 = *(long *)(puVar38 + 2) == 0 && *(long *)puVar38 == 0;
      goto LAB_001812a7;
    case 0x12:
      bVar69 = *(long *)(puVar45 + 2) == 0 && *(long *)puVar45 == 0;
      break;
    default:
      bVar69 = false;
      bVar70 = false;
      goto LAB_001812aa;
    }
    bVar69 = !bVar69;
    bVar70 = *puVar38 == 0;
LAB_001812a7:
    bVar70 = !bVar70;
LAB_001812aa:
    uVar64 = (ulong)("\x04\x05\x05\x06\a\a\b\t\t\n\v\v\f\r\r\x0e\x06\x06\b\b\n\n"
                     [txsize_to_bsize[uVar54]] <
                    "\x04\x05\x05\x06\a\a\b\t\t\n\v\v\f\r\r\x0e\x06\x06\b\b\n\n"[uVar64]) * 3 +
             (ulong)bVar70 + (ulong)bVar69 + 7;
  }
  pFVar8 = (dcb->xd).tile_ctx;
  iVar29 = 1 << ((char)(dcb->xd).bd + 7U & 0x1f);
  uVar30 = (uint)""[uVar54] + (uint)""[uVar54] + 1 >> 1;
  uVar31 = uVar30 & 0xff;
  uVar3 = *(ushort *)&pMVar7->field_0xa7;
  uVar4 = dcb->cb_offset[plane];
  ptVar9 = dcb->dqcoeff_block[plane];
  iVar32 = av1_get_tx_scale(tx_size);
  uVar55 = 10;
  uVar51 = (uint)tx_size;
  if (tx_size < 0x11) {
    uVar58 = 3;
    if ((1 < uVar51 - 0xb) && (uVar51 != 4)) {
LAB_0017f7f6:
      uVar58 = uVar54;
    }
    local_644 = (byte)tx_size_high_log2[uVar58];
    uVar48 = (uint)tx_size;
    if (tx_size < 0x11) {
      uVar58 = 3;
      if ((1 < uVar48 - 0xb) && (uVar51 != 4)) {
        uVar58 = uVar54;
      }
    }
    else {
      if (uVar48 == 0x11) goto LAB_0017f866;
      uVar58 = uVar54;
      if (uVar51 == 0x12) goto LAB_0017f830;
    }
    iVar37 = tx_size_wide[uVar58];
    if (tx_size < 0x11) {
      uVar55 = 3;
      if ((1 < uVar48 - 0xb) && (uVar48 != 4)) {
LAB_0017fc58:
        uVar55 = uVar54;
      }
    }
    else if (uVar48 == 0x11) {
      uVar55 = 9;
    }
    else if (uVar48 != 0x12) goto LAB_0017fc58;
  }
  else {
    local_644 = 5;
    if (uVar51 == 0x11) {
LAB_0017f866:
      uVar55 = 9;
      iVar37 = 0x10;
    }
    else {
      local_644 = 4;
      if (uVar51 != 0x12) goto LAB_0017f7f6;
LAB_0017f830:
      iVar37 = 0x20;
    }
  }
  iVar52 = tx_size_high[uVar55];
  paaVar53 = pFVar8->txb_skip_cdf[uVar31] + uVar64;
  dec = &r->ec;
  iVar33 = od_ec_decode_cdf_q15(dec,*paaVar53,2);
  if (r->allow_update_cdf != '\0') {
    uVar5 = (*paaVar53)[2];
    bVar40 = (char)(uVar5 >> 4) + 4;
    uVar28 = (*paaVar53)[0];
    if ((char)iVar33 < '\x01') {
      sVar6 = -(uVar28 >> (bVar40 & 0x1f));
    }
    else {
      sVar6 = (short)((int)(0x8000 - (uint)uVar28) >> (bVar40 & 0x1f));
    }
    (*paaVar53)[0] = sVar6 + uVar28;
    (*paaVar53)[2] = uVar5 + (uVar5 < 0x20);
  }
  peVar10 = dcb->eob_data[plane];
  uVar5 = dcb->txb_offset[plane];
  peVar10[uVar5].eob = 0;
  peVar10[uVar5].max_scan_line = 0;
  if (iVar33 != 0) {
    uVar30 = 0;
    if (plane == 0) {
      (dcb->xd).tx_type_map[(dcb->xd).tx_type_map_stride * row + col] = '\0';
    }
    goto LAB_00181006;
  }
  if (plane == 0) {
    av1_read_tx_type(cm,&dcb->xd,row,col,tx_size,r);
  }
  pMVar11 = *(dcb->xd).mi;
  if (((dcb->xd).lossless[*(ushort *)&pMVar11->field_0xa7 & 7] == 0) &&
     ((0x61810UL >> (uVar54 & 0x3f) & 1) == 0)) {
    if (plane == 0) {
      bVar40 = (dcb->xd).tx_type_map[(dcb->xd).tx_type_map_stride * row + col];
    }
    else {
      cVar26 = (char)*(ushort *)&pMVar11->field_0xa7;
      if ((cVar26 < '\0') || ('\0' < pMVar11->ref_frame[0])) {
        bVar40 = (dcb->xd).tx_type_map
                 [(row << ((byte)(dcb->xd).plane[1].subsampling_y & 0x1f)) *
                  (dcb->xd).tx_type_map_stride +
                  (col << ((byte)(dcb->xd).plane[1].subsampling_x & 0x1f))];
        uVar51 = 1;
        if (-1 < cVar26) {
          uVar51 = (uint)('\0' < pMVar11->ref_frame[0]);
        }
      }
      else {
        bVar40 = intra_mode_to_tx_type__intra_mode_to_tx_type
                 [(byte)get_uv_mode_uv2y[pMVar11->uv_mode]];
        uVar51 = 0;
      }
      if ((0x18608UL >> (uVar54 & 0x3f) & 1) == 0) {
        if ((cm->features).reduced_tx_set_used == false) {
          uVar51 = (uint)av1_ext_tx_set_lookup[0]
                         [(ulong)((0x60604UL >> (uVar54 & 0x3f) & 1) != 0) + (ulong)(uVar51 * 2)];
        }
        else {
          uVar51 = (uint)(byte)((uVar51 == 0) + 1);
        }
      }
      if (*(int *)((long)av1_ext_tx_used[0] + (ulong)bVar40 * 4 + (ulong)(uVar51 << 6)) == 0) {
        bVar40 = 0;
      }
    }
  }
  else {
    bVar40 = 0;
  }
  bVar70 = plane != 0;
  uVar55 = (ulong)bVar70;
  uVar58 = (ulong)bVar40;
  TVar2 = ""[uVar58];
  pqVar39 = av1_get_iqmatrix(&cm->quant_params,&dcb->xd,plane,tx_size,bVar40);
  piVar12 = av1_scan_orders[tx_size][bVar40].scan;
  bVar69 = 9 < bVar40;
  uVar64 = (ulong)bVar69;
  switch(""[uVar54]) {
  case '\0':
    icdf = pFVar8->eob_flag_cdf16[uVar55] + uVar64;
    iVar33 = od_ec_decode_cdf_q15(dec,*icdf,5);
    if (r->allow_update_cdf != '\0') {
      paVar49 = *icdf + 5;
      uVar28 = (*icdf)[5];
      bVar41 = (char)(uVar28 >> 4) + 5;
      lVar56 = 0;
      do {
        uVar82 = (*icdf)[lVar56];
        if (lVar56 < (char)iVar33) {
          sVar6 = (short)((int)(0x8000 - (uint)uVar82) >> (bVar41 & 0x1f));
        }
        else {
          sVar6 = -(uVar82 >> (bVar41 & 0x1f));
        }
        (*icdf)[lVar56] = sVar6 + uVar82;
        lVar56 = lVar56 + 1;
      } while (lVar56 != 4);
LAB_00180233:
      *paVar49 = *paVar49 + (ushort)(uVar28 < 0x20);
    }
    break;
  case '\x01':
    lVar56 = (ulong)bVar69 * 0x10 + uVar64 * -2 + uVar55 * 0x1c;
    puVar68 = (uint16_t *)((long)pFVar8 + lVar56 + 0x3f6);
    iVar33 = od_ec_decode_cdf_q15(dec,puVar68,6);
    if (r->allow_update_cdf != '\0') {
      paVar49 = (aom_cdf_prob *)((long)pFVar8 + lVar56 + 0x402);
      uVar28 = *(ushort *)((long)pFVar8 + lVar56 + 0x402);
      bVar41 = (char)(uVar28 >> 4) + 5;
      lVar56 = 0;
      do {
        uVar82 = puVar68[lVar56];
        if (lVar56 < (char)iVar33) {
          sVar6 = (short)((int)(0x8000 - (uint)uVar82) >> (bVar41 & 0x1f));
        }
        else {
          sVar6 = -(uVar82 >> (bVar41 & 0x1f));
        }
        puVar68[lVar56] = sVar6 + uVar82;
        lVar56 = lVar56 + 1;
      } while (lVar56 != 5);
      goto LAB_00180233;
    }
    break;
  case '\x02':
    icdf_02 = pFVar8->eob_flag_cdf64[bVar70] + bVar69;
    iVar33 = od_ec_decode_cdf_q15(dec,*icdf_02,7);
    if (r->allow_update_cdf != '\0') {
      paVar49 = pFVar8->eob_flag_cdf64[bVar70][bVar69] + 7;
      uVar28 = pFVar8->eob_flag_cdf64[bVar70][bVar69][7];
      bVar41 = (char)(uVar28 >> 4) + 5;
      lVar56 = 0;
      do {
        uVar82 = (*icdf_02)[lVar56];
        if (lVar56 < (char)iVar33) {
          sVar6 = (short)((int)(0x8000 - (uint)uVar82) >> (bVar41 & 0x1f));
        }
        else {
          sVar6 = -(uVar82 >> (bVar41 & 0x1f));
        }
        (*icdf_02)[lVar56] = sVar6 + uVar82;
        lVar56 = lVar56 + 1;
      } while (lVar56 != 6);
      goto LAB_00180233;
    }
    break;
  case '\x03':
    icdf_01 = pFVar8->eob_flag_cdf128[uVar55] + uVar64;
    iVar33 = od_ec_decode_cdf_q15(dec,*icdf_01,8);
    if (r->allow_update_cdf != '\0') {
      paVar49 = *icdf_01 + 8;
      uVar28 = (*icdf_01)[8];
      bVar41 = (char)(uVar28 >> 4) + 5;
      lVar56 = 0;
      do {
        uVar82 = (*icdf_01)[lVar56];
        if (lVar56 < (char)iVar33) {
          sVar6 = (short)((int)(0x8000 - (uint)uVar82) >> (bVar41 & 0x1f));
        }
        else {
          sVar6 = -(uVar82 >> (bVar41 & 0x1f));
        }
        (*icdf_01)[lVar56] = sVar6 + uVar82;
        lVar56 = lVar56 + 1;
      } while (lVar56 != 7);
      goto LAB_00180233;
    }
    break;
  case '\x04':
    icdf_00 = pFVar8->eob_flag_cdf256[uVar55] + uVar64;
    iVar33 = od_ec_decode_cdf_q15(dec,*icdf_00,9);
    if (r->allow_update_cdf != '\0') {
      paVar49 = *icdf_00 + 9;
      uVar28 = (*icdf_00)[9];
      cVar26 = (char)iVar33;
      auVar74._0_4_ = -(uint)('\x06' < cVar26);
      auVar74._4_4_ = -(uint)('\x06' < cVar26);
      auVar74._8_4_ = -(uint)('\a' < cVar26);
      auVar74._12_4_ = -(uint)('\a' < cVar26);
      uVar51 = (uVar28 >> 4) + 5;
      auVar76._0_4_ = -(uint)('\x04' < cVar26);
      auVar76._4_4_ = -(uint)('\x04' < cVar26);
      auVar76._8_4_ = -(uint)('\x05' < cVar26);
      auVar76._12_4_ = -(uint)('\x05' < cVar26);
      auVar77 = packssdw(auVar76,auVar74);
      auVar75._8_4_ = 0xffffffff;
      auVar75._0_8_ = 0xffffffffffffffff;
      auVar75._12_4_ = 0xffffffff;
      auVar79._0_4_ = -(uint)('\x02' < cVar26);
      auVar79._4_4_ = -(uint)('\x02' < cVar26);
      auVar79._8_4_ = -(uint)('\x03' < cVar26);
      auVar79._12_4_ = -(uint)('\x03' < cVar26);
      auVar71._0_4_ = -(uint)('\0' < cVar26);
      auVar71._4_4_ = -(uint)('\0' < cVar26);
      auVar71._8_4_ = -(uint)('\x01' < cVar26);
      auVar71._12_4_ = -(uint)('\x01' < cVar26);
      auVar72 = packssdw(auVar71,auVar79);
      auVar77 = packssdw(auVar72 ^ auVar75,auVar77 ^ auVar75);
      auVar72 = *(undefined1 (*) [16])*icdf_00;
      uVar82 = auVar72._8_2_;
      uVar83 = auVar72._10_2_;
      uVar84 = auVar72._12_2_;
      uVar85 = auVar72._14_2_;
      uVar88 = auVar72._6_2_;
      auVar13._10_2_ = 0;
      auVar13._0_10_ = auVar72._0_10_;
      auVar13._12_2_ = uVar88;
      auVar14._8_2_ = auVar72._4_2_;
      auVar14._0_8_ = auVar72._0_8_;
      auVar14._10_4_ = auVar13._10_4_;
      auVar24._6_8_ = 0;
      auVar24._0_6_ = auVar14._8_6_;
      auVar16._4_2_ = auVar72._2_2_;
      auVar16._0_4_ = auVar72._0_4_;
      auVar16._6_8_ = SUB148(auVar24 << 0x40,6);
      uVar48 = auVar72._0_4_ & 0xffff;
      auVar89 = ZEXT416(uVar51);
      uVar64 = (ulong)uVar51;
      auVar81._0_4_ = (int)(short)(uVar82 >> uVar64);
      auVar81._4_4_ = (int)(short)(uVar83 >> uVar64);
      auVar81._8_4_ = (int)(short)(uVar84 >> uVar64);
      auVar81._12_4_ = (int)(short)(uVar85 >> uVar64);
      auVar86._0_4_ = (int)(short)(uVar48 >> uVar64);
      auVar86._4_4_ = (int)(short)(auVar16._4_4_ >> uVar64);
      auVar86._8_4_ = (int)(short)(auVar14._8_4_ >> uVar64);
      auVar86._12_4_ = (int)(short)(uVar88 >> uVar64);
      auVar87 = packssdw(auVar86,auVar81);
      auVar90._0_4_ = (int)(short)((int)(0x8000 - (uint)uVar82) >> auVar89);
      auVar90._4_4_ = (int)(short)((int)(0x8000 - (uint)uVar83) >> auVar89);
      auVar90._8_4_ = (int)(short)((int)(0x8000 - (uint)uVar84) >> auVar89);
      auVar90._12_4_ = (int)(short)((int)(0x8000 - (uint)uVar85) >> auVar89);
      auVar80._0_4_ = (int)(short)((int)(0x8000 - uVar48) >> auVar89);
      auVar80._4_4_ = (int)(short)((int)(0x8000 - auVar16._4_4_) >> auVar89);
      auVar80._8_4_ = (int)(short)((int)(0x8000 - auVar14._8_4_) >> auVar89);
      auVar80._12_4_ = (int)(short)((int)(0x8000 - (uint)uVar88) >> auVar89);
      auVar89 = packssdw(auVar80,auVar90);
      auVar78._2_2_ = -auVar87._2_2_;
      auVar78._0_2_ = -auVar87._0_2_;
      auVar78._4_2_ = -auVar87._4_2_;
      auVar78._6_2_ = -auVar87._6_2_;
      auVar78._8_2_ = -auVar87._8_2_;
      auVar78._10_2_ = -auVar87._10_2_;
      auVar78._12_2_ = -auVar87._12_2_;
      auVar78._14_2_ = -auVar87._14_2_;
      auVar77 = ~auVar77 & auVar89 | auVar78 & auVar77;
      (*icdf_00)[0] = auVar77._0_2_ + auVar72._0_2_;
      (*icdf_00)[1] = auVar77._2_2_ + auVar72._2_2_;
      (*icdf_00)[2] = auVar77._4_2_ + auVar72._4_2_;
      (*icdf_00)[3] = auVar77._6_2_ + uVar88;
      (*icdf_00)[4] = auVar77._8_2_ + uVar82;
      (*icdf_00)[5] = auVar77._10_2_ + uVar83;
      (*icdf_00)[6] = auVar77._12_2_ + uVar84;
      (*icdf_00)[7] = auVar77._14_2_ + uVar85;
      goto LAB_00180233;
    }
    break;
  case '\x05':
    icdf_03 = pFVar8->eob_flag_cdf512[uVar55] + uVar64;
    iVar33 = od_ec_decode_cdf_q15(dec,*icdf_03,10);
    if (r->allow_update_cdf != '\0') {
      paVar49 = pFVar8->eob_flag_cdf512[uVar55][uVar64] + 10;
      uVar28 = pFVar8->eob_flag_cdf512[uVar55][uVar64][10];
      bVar41 = (char)(uVar28 >> 4) + 5;
      lVar56 = 0;
      do {
        uVar82 = (*icdf_03)[lVar56];
        if (lVar56 < (char)iVar33) {
          sVar6 = (short)((int)(0x8000 - (uint)uVar82) >> (bVar41 & 0x1f));
        }
        else {
          sVar6 = -(uVar82 >> (bVar41 & 0x1f));
        }
        (*icdf_03)[lVar56] = sVar6 + uVar82;
        lVar56 = lVar56 + 1;
      } while (lVar56 != 9);
      goto LAB_00180233;
    }
    break;
  default:
    uVar60 = (ulong)((uint)bVar70 * 0x30);
    puVar68 = (uint16_t *)((long)pFVar8->eob_flag_cdf1024[0][uVar64] + uVar60);
    iVar33 = od_ec_decode_cdf_q15(dec,puVar68,0xb);
    if (r->allow_update_cdf != '\0') {
      paVar49 = (aom_cdf_prob *)((long)pFVar8->eob_flag_cdf1024[0][uVar64] + uVar60 + 0x16);
      uVar28 = *(ushort *)((long)pFVar8->eob_flag_cdf1024[0][uVar64] + uVar60 + 0x16);
      bVar41 = (char)(uVar28 >> 4) + 5;
      lVar56 = 0;
      do {
        uVar82 = puVar68[lVar56];
        if (lVar56 < (char)iVar33) {
          sVar6 = (short)((int)(0x8000 - (uint)uVar82) >> (bVar41 & 0x1f));
        }
        else {
          sVar6 = -(uVar82 >> (bVar41 & 0x1f));
        }
        puVar68[lVar56] = sVar6 + uVar82;
        lVar56 = lVar56 + 1;
      } while (lVar56 != 10);
      goto LAB_00180233;
    }
  }
  sVar6 = av1_eob_offset_bits[(long)iVar33 + 1];
  iVar67 = (int)sVar6;
  iVar34 = 0;
  if (0 < sVar6) {
    iVar34 = iVar33 + -2;
    paaVar53 = pFVar8->eob_extra_cdf[uVar31][uVar55] + iVar34;
    iVar35 = od_ec_decode_cdf_q15(dec,*paaVar53,2);
    if (r->allow_update_cdf != '\0') {
      uVar28 = pFVar8->eob_extra_cdf[uVar31][uVar55][iVar34][2];
      bVar41 = (char)(uVar28 >> 4) + 4;
      uVar82 = (*paaVar53)[0];
      if ((char)iVar35 < '\x01') {
        sVar15 = -(uVar82 >> (bVar41 & 0x1f));
      }
      else {
        sVar15 = (short)((int)(0x8000 - (uint)uVar82) >> (bVar41 & 0x1f));
      }
      (*paaVar53)[0] = sVar15 + uVar82;
      pFVar8->eob_extra_cdf[uVar31][uVar55][iVar34][2] = uVar28 + (uVar28 < 0x20);
    }
    iVar34 = 1 << ((char)sVar6 - 1U & 0x1f);
    if (iVar35 == 0) {
      iVar34 = 0;
    }
    if (sVar6 != 1) {
      iVar35 = 2;
      if (2 < iVar67) {
        iVar35 = iVar67;
      }
      iVar35 = iVar35 + -1;
      iVar67 = iVar67 + -2;
      do {
        iVar36 = od_ec_decode_bool_q15(dec,0x4000);
        iVar47 = 1 << ((byte)iVar67 & 0x1f);
        if (iVar36 == 0) {
          iVar47 = 0;
        }
        iVar34 = iVar34 + iVar47;
        iVar67 = iVar67 + -1;
        iVar35 = iVar35 + -1;
      } while (iVar35 != 0);
    }
  }
  iVar67 = 0;
  if (2 < av1_eob_group_start[(long)iVar33 + 1]) {
    iVar67 = iVar34;
  }
  uVar51 = iVar67 + (uint)(ushort)av1_eob_group_start[(long)iVar33 + 1];
  peVar10[uVar5].eob = (uint16_t)uVar51;
  if ((uVar51 & 0xfffe) != 0) {
    memset(local_558,0,((long)iVar37 + 4) * ((long)iVar52 + 4) + 0x10);
  }
  uVar51 = uVar51 & 0xffff;
  if (uVar51 == 1) {
    uVar64 = 0;
  }
  else {
    bVar41 = local_644 & 0x1f;
    iVar33 = iVar37 << bVar41;
    iVar52 = iVar33 + 7;
    if (-1 < iVar37 << bVar41) {
      iVar52 = iVar33;
    }
    uVar64 = 1;
    if (iVar52 >> 3 < (int)(uVar51 - 1)) {
      iVar52 = iVar33 + 3;
      if (-1 < iVar37 << bVar41) {
        iVar52 = iVar33;
      }
      uVar64 = (ulong)(iVar52 >> 2 < (int)(uVar51 - 1)) | 2;
    }
  }
  sVar6 = piVar12[(ulong)uVar51 - 1];
  iVar52 = (int)sVar6;
  uVar60 = (ulong)(uVar31 << 6);
  puVar68 = (uint16_t *)((long)pFVar8->coeff_base_eob_cdf[0][bVar70][uVar64] + uVar60);
  iVar37 = od_ec_decode_cdf_q15(dec,puVar68,3);
  if (r->allow_update_cdf != '\0') {
    uVar28 = *(ushort *)((long)pFVar8->coeff_base_eob_cdf[0][bVar70][uVar64] + uVar60 + 6);
    bVar41 = (char)(uVar28 >> 4) + 4;
    lVar56 = 0;
    do {
      uVar82 = puVar68[lVar56];
      if (lVar56 < (char)iVar37) {
        sVar15 = (short)((int)(0x8000 - (uint)uVar82) >> (bVar41 & 0x1f));
      }
      else {
        sVar15 = -(uVar82 >> (bVar41 & 0x1f));
      }
      puVar68[lVar56] = sVar15 + uVar82;
      lVar56 = lVar56 + 1;
    } while (lVar56 != 2);
    psVar1 = (short *)((long)pFVar8->coeff_base_eob_cdf[0][bVar70][uVar64] + uVar60 + 6);
    *psVar1 = *psVar1 + (ushort)(uVar28 < 0x20);
  }
  iVar33 = iVar37 + 1;
  bVar43 = (byte)iVar33;
  iVar34 = iVar52 >> (local_644 & 0x1f);
  bVar41 = (byte)uVar30;
  if (1 < iVar37) {
    iVar37 = iVar34 << (local_644 & 0x1f);
    if (sVar6 == 0) {
      lVar56 = 0;
    }
    else {
      lVar56 = 7;
      if ((((9 < bVar40) || (1 < iVar52 - iVar37)) || (1 < iVar34)) &&
         (((0xa800UL >> (uVar58 & 0x3f) & 1) == 0 || (iVar34 != 0)))) {
        if (iVar52 != iVar37) {
          lVar56 = 0xe;
        }
        if ((0x5400UL >> (uVar58 & 0x3f) & 1) == 0) {
          lVar56 = 0xe;
        }
      }
    }
    bVar42 = 3;
    if (bVar41 < 3) {
      bVar42 = bVar41;
    }
    paaVar46 = pFVar8->coeff_br_cdf[bVar42][uVar55] + lVar56;
    uVar30 = 0;
    do {
      iVar37 = od_ec_decode_cdf_q15(dec,*paaVar46,4);
      if (r->allow_update_cdf != '\0') {
        uVar28 = pFVar8->coeff_br_cdf[bVar42][uVar55][lVar56][4];
        bVar43 = (char)(uVar28 >> 4) + 5;
        lVar59 = 0;
        do {
          uVar82 = (*paaVar46)[lVar59];
          if (lVar59 < (char)iVar37) {
            sVar6 = (short)((int)(0x8000 - (uint)uVar82) >> (bVar43 & 0x1f));
          }
          else {
            sVar6 = -(uVar82 >> (bVar43 & 0x1f));
          }
          (*paaVar46)[lVar59] = sVar6 + uVar82;
          lVar59 = lVar59 + 1;
        } while (lVar59 != 3);
        paVar49 = pFVar8->coeff_br_cdf[bVar42][uVar55][lVar56] + 4;
        *paVar49 = *paVar49 + (ushort)(uVar28 < 0x20);
      }
      iVar33 = iVar33 + iVar37;
      bVar43 = (byte)iVar33;
    } while ((2 < iVar37) && (bVar69 = uVar30 < 9, uVar30 = uVar30 + 3, bVar69));
  }
  local_558[iVar52 + iVar34 * 4] = bVar43;
  uVar28 = peVar10[uVar5].eob;
  if (1 < uVar28) {
    bVar43 = 3;
    if (bVar41 < 3) {
      bVar43 = bVar41;
    }
    if (bVar40 < 10) {
      if (uVar28 != 2) {
        iVar37 = 1 << (local_644 & 0x1f);
        iVar52 = iVar37 + 4;
        uVar64 = (ulong)(uVar28 - 2);
        do {
          sVar6 = piVar12[uVar64];
          uVar30 = (int)sVar6 >> (local_644 & 0x1f);
          lVar56 = (long)(int)((int)sVar6 + uVar30 * 4);
          pbVar62 = local_558 + lVar56;
          bVar40 = pbVar62[(long)iVar37 + 4];
          if (2 < pbVar62[(long)iVar37 + 4]) {
            bVar40 = 3;
          }
          bVar41 = local_558[lVar56 + 1];
          if (2 < bVar41) {
            bVar41 = 3;
          }
          bVar42 = pbVar62[(long)iVar37 + 5];
          if (2 < bVar42) {
            bVar42 = 3;
          }
          bVar57 = pbVar62[(long)(2 << (local_644 & 0x1f)) + 8];
          if (2 < bVar57) {
            bVar57 = 3;
          }
          bVar44 = local_558[lVar56 + 2];
          if (2 < bVar44) {
            bVar44 = 3;
          }
          bVar40 = (byte)(bVar57 + bVar42 + bVar41 + bVar40 + bVar44 + 1) >> 1;
          if (3 < bVar40) {
            bVar40 = 4;
          }
          paaVar46 = pFVar8->coeff_base_cdf[uVar31][uVar55] +
                     (ulong)bVar40 + (long)av1_nz_map_ctx_offset[uVar54][sVar6];
          iVar33 = od_ec_decode_cdf_q15(dec,*paaVar46,4);
          if (r->allow_update_cdf != '\0') {
            uVar28 = (*paaVar46)[4];
            bVar40 = (char)(uVar28 >> 4) + 5;
            lVar56 = 0;
            do {
              uVar82 = (*paaVar46)[lVar56];
              if (lVar56 < (char)iVar33) {
                sVar15 = (short)((int)(0x8000 - (uint)uVar82) >> (bVar40 & 0x1f));
              }
              else {
                sVar15 = -(uVar82 >> (bVar40 & 0x1f));
              }
              (*paaVar46)[lVar56] = sVar15 + uVar82;
              lVar56 = lVar56 + 1;
            } while (lVar56 != 3);
            (*paaVar46)[4] = (*paaVar46)[4] + (ushort)(uVar28 < 0x20);
          }
          if (2 < iVar33) {
            uVar51 = (int)sVar6 - (uVar30 << (local_644 & 0x1f));
            iVar34 = uVar30 * iVar52 + uVar51;
            bVar40 = local_558[(long)iVar34 + 1];
            if (0xe < local_558[(long)iVar34 + 1]) {
              bVar40 = 0xf;
            }
            bVar41 = local_558[iVar34 + iVar52];
            if (0xe < bVar41) {
              bVar41 = 0xf;
            }
            bVar42 = local_558[iVar34 + 1 + iVar52];
            if (0xe < bVar42) {
              bVar42 = 0xf;
            }
            bVar40 = (byte)(bVar41 + bVar40 + bVar42 + 1) >> 1;
            if (5 < bVar40) {
              bVar40 = 6;
            }
            paaVar46 = pFVar8->coeff_br_cdf[bVar43][uVar55] + 0xe;
            if ((int)(uVar51 | uVar30) < 2) {
              paaVar46 = pFVar8->coeff_br_cdf[bVar43][uVar55] + 7;
            }
            paaVar46 = paaVar46 + bVar40;
            uVar30 = 0;
            do {
              iVar34 = od_ec_decode_cdf_q15(dec,*paaVar46,4);
              if (r->allow_update_cdf != '\0') {
                uVar28 = (*paaVar46)[4];
                bVar40 = (char)(uVar28 >> 4) + 5;
                lVar56 = 0;
                do {
                  uVar82 = (*paaVar46)[lVar56];
                  if (lVar56 < (char)iVar34) {
                    sVar6 = (short)((int)(0x8000 - (uint)uVar82) >> (bVar40 & 0x1f));
                  }
                  else {
                    sVar6 = -(uVar82 >> (bVar40 & 0x1f));
                  }
                  (*paaVar46)[lVar56] = sVar6 + uVar82;
                  lVar56 = lVar56 + 1;
                } while (lVar56 != 3);
                (*paaVar46)[4] = (*paaVar46)[4] + (ushort)(uVar28 < 0x20);
              }
              iVar33 = iVar33 + iVar34;
            } while ((2 < iVar34) && (bVar69 = uVar30 < 9, uVar30 = uVar30 + 3, bVar69));
          }
          *pbVar62 = (byte)iVar33;
          bVar69 = 1 < (long)uVar64;
          uVar64 = uVar64 - 1;
        } while (bVar69);
      }
      uVar64 = 0;
    }
    else {
      uVar64 = (ulong)(uVar28 - 2);
    }
    lVar66 = (long)(1 << (local_644 & 0x1f));
    lVar56 = lVar66 + 4;
    lVar59 = (long)(2 << (local_644 & 0x1f));
    iVar37 = (int)lVar56;
    do {
      sVar6 = piVar12[uVar64];
      uVar30 = (uint)sVar6;
      iVar33 = (int)uVar30 >> (local_644 & 0x1f);
      lVar61 = (long)(int)(uVar30 + iVar33 * 4);
      pbVar62 = local_558 + lVar61;
      iVar52 = (uint)""[local_558[lVar61 + 1]] + (uint)""[pbVar62[lVar56]];
      if (TVar2 == '\x02') {
        iVar52 = iVar52 + (uint)""[local_558[lVar61 + 3]] + (uint)""[local_558[lVar61 + 2]];
        pbVar50 = local_558 + lVar61 + 4;
      }
      else if (TVar2 == '\0') {
        iVar52 = iVar52 + (uint)""[local_558[lVar59 + lVar61 + 8]] +
                          (uint)""[local_558[lVar66 + lVar61 + 5]];
        pbVar50 = local_558 + lVar61 + 2;
      }
      else {
        iVar52 = iVar52 + (uint)""[abStack_54c[(3 << (local_644 & 0x1f)) + lVar61]] +
                          (uint)""[local_558[lVar59 + lVar61 + 8]];
        pbVar50 = pbVar62 + (long)(4 << (local_644 & 0x1f)) + 0x10;
      }
      iVar34 = 0;
      if (uVar30 != 0 || TVar2 != '\0') {
        uVar51 = iVar52 + (uint)""[*pbVar50] + 1 >> 1;
        if (3 < uVar51) {
          uVar51 = 4;
        }
        if (TVar2 == '\x02') {
          uVar58 = (ulong)(uVar30 & ~(-1 << (local_644 & 0x1f)));
LAB_00180aa3:
          iVar34 = nz_map_ctx_offset_1d[uVar58];
        }
        else {
          if (TVar2 == '\x01') {
            uVar58 = (ulong)iVar33;
            goto LAB_00180aa3;
          }
          if (TVar2 != '\0') goto LAB_00180aaf;
          iVar34 = (int)av1_nz_map_ctx_offset[uVar54][(int)uVar30];
        }
        iVar34 = uVar51 + iVar34;
      }
LAB_00180aaf:
      paaVar46 = pFVar8->coeff_base_cdf[uVar31][uVar55] + iVar34;
      iVar52 = od_ec_decode_cdf_q15(dec,*paaVar46,4);
      if (r->allow_update_cdf != '\0') {
        uVar28 = (*paaVar46)[4];
        bVar40 = (char)(uVar28 >> 4) + 5;
        lVar61 = 0;
        do {
          uVar82 = (*paaVar46)[lVar61];
          if (lVar61 < (char)iVar52) {
            sVar15 = (short)((int)(0x8000 - (uint)uVar82) >> (bVar40 & 0x1f));
          }
          else {
            sVar15 = -(uVar82 >> (bVar40 & 0x1f));
          }
          (*paaVar46)[lVar61] = sVar15 + uVar82;
          lVar61 = lVar61 + 1;
        } while (lVar61 != 3);
        (*paaVar46)[4] = (*paaVar46)[4] + (ushort)(uVar28 < 0x20);
      }
      if (2 < iVar52) {
        uVar48 = iVar33 << (local_644 & 0x1f);
        iVar34 = uVar30 - uVar48;
        iVar67 = iVar33 * iVar37 + iVar34;
        uVar51 = (uint)local_558[iVar37 + iVar67] + (uint)local_558[(long)iVar67 + 1];
        if (TVar2 == '\x02') {
          uVar51 = uVar51 + local_558[(long)iVar67 + 2] + 1 >> 1;
          if (5 < uVar51) {
            uVar51 = 6;
          }
          if (sVar6 != 0) {
            if (uVar30 != uVar48) goto LAB_00180c26;
            uVar51 = uVar51 + 7;
          }
        }
        else if (TVar2 == '\x01') {
          uVar51 = uVar51 + local_558[iVar67 + iVar37 * 2] + 1 >> 1;
          if (5 < uVar51) {
            uVar51 = 6;
          }
          if (sVar6 != 0) {
            if (iVar33 != 0) goto LAB_00180c26;
LAB_00180bed:
            uVar51 = uVar51 + 7;
          }
        }
        else {
          if (TVar2 == '\0') {
            uVar51 = uVar51 + local_558[(long)(iVar37 + iVar67) + 1] + 1 >> 1;
            if (5 < uVar51) {
              uVar51 = 6;
            }
            if (sVar6 == 0) goto LAB_00180c29;
            if ((iVar33 < 2) && (iVar34 < 2)) goto LAB_00180bed;
          }
LAB_00180c26:
          uVar51 = uVar51 + 0xe;
        }
LAB_00180c29:
        paaVar46 = pFVar8->coeff_br_cdf[bVar43][uVar55] + uVar51;
        uVar30 = 0 >> (local_644 & 0x1f);
        do {
          iVar33 = od_ec_decode_cdf_q15(dec,*paaVar46,4);
          if (r->allow_update_cdf != '\0') {
            uVar28 = (*paaVar46)[4];
            bVar40 = (char)(uVar28 >> 4) + 5;
            lVar61 = 0;
            do {
              uVar82 = (*paaVar46)[lVar61];
              if (lVar61 < (char)iVar33) {
                sVar6 = (short)((int)(0x8000 - (uint)uVar82) >> (bVar40 & 0x1f));
              }
              else {
                sVar6 = -(uVar82 >> (bVar40 & 0x1f));
              }
              (*paaVar46)[lVar61] = sVar6 + uVar82;
              lVar61 = lVar61 + 1;
            } while (lVar61 != 3);
            (*paaVar46)[4] = (*paaVar46)[4] + (ushort)(uVar28 < 0x20);
          }
          iVar52 = iVar52 + iVar33;
        } while ((2 < iVar33) && (bVar69 = uVar30 < 9, uVar30 = uVar30 + 3, bVar69));
      }
      *pbVar62 = (byte)iVar52;
      bVar69 = 0 < (long)uVar64;
      uVar64 = uVar64 - 1;
    } while (bVar69);
    uVar28 = peVar10[uVar5].eob;
  }
  uVar64 = (ulong)uVar28;
  if (uVar28 == 0) {
    uVar30 = 0;
  }
  else {
    uVar51 = iVar29 - 1;
    uVar31 = -iVar29;
    lVar56 = (long)local_661;
    paaVar53 = pFVar8->dc_sign_cdf[uVar55] + lVar56;
    uVar58 = 0;
    uVar30 = 0;
    iVar29 = 0;
    do {
      iVar37 = (int)piVar12[uVar58];
      bVar40 = local_558[iVar37 + (iVar37 >> (local_644 & 0x1f)) * 4];
      uVar48 = (uint)bVar40;
      if (bVar40 != 0) {
        uVar28 = peVar10[uVar5].max_scan_line;
        if ((int)(uint)peVar10[uVar5].max_scan_line <= iVar37) {
          uVar28 = piVar12[uVar58];
        }
        peVar10[uVar5].max_scan_line = uVar28;
        if (uVar58 == 0) {
          iVar52 = od_ec_decode_cdf_q15(dec,*paaVar53,2);
          cVar26 = (char)iVar52;
          if (r->allow_update_cdf != '\0') {
            uVar28 = pFVar8->dc_sign_cdf[uVar55][lVar56][2];
            bVar41 = (char)(uVar28 >> 4) + 4;
            uVar82 = (*paaVar53)[0];
            if (cVar26 < '\x01') {
              sVar6 = -(uVar82 >> (bVar41 & 0x1f));
            }
            else {
              sVar6 = (short)((int)(0x8000 - (uint)uVar82) >> (bVar41 & 0x1f));
            }
            (*paaVar53)[0] = sVar6 + uVar82;
            pFVar8->dc_sign_cdf[uVar55][lVar56][2] = uVar28 + (uVar28 < 0x20);
          }
        }
        else {
          iVar52 = od_ec_decode_bool_q15(dec,0x4000);
          cVar26 = (char)iVar52;
        }
        if (0xe < bVar40) {
          uVar48 = 0;
          iVar52 = 0;
          do {
            if (iVar52 != 0) {
              iVar52 = 0;
              if (1 < uVar48) goto LAB_00180eb9;
              goto LAB_00180edb;
            }
            iVar52 = od_ec_decode_bool_q15(dec,0x4000);
            uVar48 = uVar48 + 1;
          } while (uVar48 != 0x15);
          aom_internal_error((dcb->xd).error_info,AOM_CODEC_CORRUPT_FRAME,
                             "Invalid length in read_golomb");
          uVar48 = 0x15;
LAB_00180eb9:
          iVar33 = uVar48 - 1;
          iVar52 = 1;
          do {
            iVar34 = od_ec_decode_bool_q15(dec,0x4000);
            iVar52 = iVar34 + iVar52 * 2;
            iVar33 = iVar33 + -1;
          } while (iVar33 != 0);
          iVar52 = iVar52 + -1;
LAB_00180edb:
          uVar48 = (uint)bVar40 + iVar52;
        }
        uVar65 = -uVar48;
        if (cVar26 == '\0') {
          uVar65 = uVar48;
        }
        if (uVar58 == 0) {
          uVar30 = uVar65;
        }
        iVar52 = (int)(dcb->xd).plane[plane].seg_dequant_QTX[uVar3 & 7][(long)piVar12[uVar58] != 0];
        if (pqVar39 != (qm_val_t *)0x0) {
          iVar52 = (int)((uint)pqVar39[piVar12[uVar58]] * iVar52 + 0x10) >> 5;
        }
        iVar29 = iVar29 + (uVar48 & 0xfffff);
        uVar65 = ((uVar48 & 0xfffff) * iVar52 & 0xffffff) >> ((byte)iVar32 & 0x1f);
        uVar48 = -uVar65;
        if (cVar26 == '\0') {
          uVar48 = uVar65;
        }
        uVar65 = uVar51;
        if ((int)uVar48 < (int)uVar51) {
          uVar65 = uVar48;
        }
        if ((int)uVar48 < (int)uVar31) {
          uVar65 = uVar31;
        }
        ptVar9[(ulong)uVar4 + (long)iVar37] = uVar65;
        uVar64 = (ulong)peVar10[uVar5].eob;
      }
      uVar58 = uVar58 + 1;
    } while (uVar58 < uVar64);
    iVar32 = 7;
    if (iVar29 < 7) {
      iVar32 = iVar29;
    }
    bVar41 = (byte)iVar32;
    bVar40 = bVar41 + 0x10;
    if (uVar30 == 0) {
      bVar40 = bVar41;
    }
    if ((int)uVar30 < 0) {
      bVar40 = bVar41 | 8;
    }
    uVar30 = (uint)bVar40;
  }
LAB_00181006:
  av1_set_entropy_contexts
            (&dcb->xd,(dcb->xd).plane + plane,plane,plane_bsize,tx_size,uVar30,col,row);
  if (((pMVar7->field_0xa7 & 0x80) != 0) || ('\0' < pMVar7->ref_frame[0])) {
    if (((dcb->xd).lossless[*(ushort *)&(*(dcb->xd).mi)->field_0xa7 & 7] == 0) &&
       ((0x61810UL >> (uVar54 & 0x3f) & 1) == 0)) {
      if (plane != 0) {
        return;
      }
      uVar27 = (dcb->xd).tx_type_map[row * (dcb->xd).tx_type_map_stride + col];
    }
    else {
      if (plane != 0) {
        return;
      }
      uVar27 = '\0';
    }
    iVar29 = *(int *)((long)tx_size_wide_unit + (ulong)((uint)tx_size * 4));
    iVar32 = *(int *)((long)tx_size_high_unit + (ulong)((uint)tx_size * 4));
    if (((0x41010UL >> (uVar54 & 0x3f) & 1) != 0) || ((0x20810UL >> (uVar54 & 0x3f) & 1) != 0)) {
      lVar56 = (long)(dcb->xd).tx_type_map_stride;
      lVar66 = row * lVar56 + (long)col;
      lVar59 = 0;
      do {
        lVar61 = 0;
        do {
          (dcb->xd).tx_type_map[lVar61 + lVar66] = uVar27;
          lVar61 = lVar61 + 4;
        } while (lVar61 < iVar29);
        lVar59 = lVar59 + 4;
        lVar66 = lVar66 + lVar56 * 4;
      } while (lVar59 < iVar32);
    }
  }
  return;
}

Assistant:

void av1_read_coeffs_txb(const AV1_COMMON *const cm, DecoderCodingBlock *dcb,
                         aom_reader *const r, const int plane, const int row,
                         const int col, const TX_SIZE tx_size) {
#if TXCOEFF_TIMER
  struct aom_usec_timer timer;
  aom_usec_timer_start(&timer);
#endif
  MACROBLOCKD *const xd = &dcb->xd;
  MB_MODE_INFO *const mbmi = xd->mi[0];
  struct macroblockd_plane *const pd = &xd->plane[plane];

  const BLOCK_SIZE bsize = mbmi->bsize;
  assert(bsize < BLOCK_SIZES_ALL);
  const BLOCK_SIZE plane_bsize =
      get_plane_block_size(bsize, pd->subsampling_x, pd->subsampling_y);

  TXB_CTX txb_ctx;
  get_txb_ctx(plane_bsize, tx_size, plane, pd->above_entropy_context + col,
              pd->left_entropy_context + row, &txb_ctx);
  const uint8_t cul_level =
      read_coeffs_txb(cm, dcb, r, row, col, plane, &txb_ctx, tx_size);
  av1_set_entropy_contexts(xd, pd, plane, plane_bsize, tx_size, cul_level, col,
                           row);

  if (is_inter_block(mbmi)) {
    const PLANE_TYPE plane_type = get_plane_type(plane);
    // tx_type will be read out in av1_read_coeffs_txb_facade
    const TX_TYPE tx_type = av1_get_tx_type(xd, plane_type, row, col, tx_size,
                                            cm->features.reduced_tx_set_used);

    if (plane == 0) {
      const int txw = tx_size_wide_unit[tx_size];
      const int txh = tx_size_high_unit[tx_size];
      // The 16x16 unit is due to the constraint from tx_64x64 which sets the
      // maximum tx size for chroma as 32x32. Coupled with 4x1 transform block
      // size, the constraint takes effect in 32x16 / 16x32 size too. To solve
      // the intricacy, cover all the 16x16 units inside a 64 level transform.
      if (txw == tx_size_wide_unit[TX_64X64] ||
          txh == tx_size_high_unit[TX_64X64]) {
        const int tx_unit = tx_size_wide_unit[TX_16X16];
        const int stride = xd->tx_type_map_stride;
        for (int idy = 0; idy < txh; idy += tx_unit) {
          for (int idx = 0; idx < txw; idx += tx_unit) {
            xd->tx_type_map[(row + idy) * stride + col + idx] = tx_type;
          }
        }
      }
    }
  }

#if TXCOEFF_TIMER
  aom_usec_timer_mark(&timer);
  const int64_t elapsed_time = aom_usec_timer_elapsed(&timer);
  cm->txcoeff_timer += elapsed_time;
  ++cm->txb_count;
#endif
}